

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMarkers::ArchiveIN(ChLinkMarkers *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<int> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMarkers>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_30._value = &this->markID1;
  local_30._name = "markID1";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->markID2;
  local_48._name = "markID2";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMarkers::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMarkers>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(markID1);
    marchive >> CHNVP(markID2);
}